

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int cppcms_capi_session_set_exposed(cppcms_capi_session *session,char *key,int is_exposed)

{
  session_interface *this;
  int iVar1;
  allocator local_49;
  string local_48;
  
  iVar1 = -1;
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_41bcbf::check_str(key);
    cppcms_capi_session::check_loaded_unsaved(session);
    this = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_48,key,&local_49);
    cppcms::session_interface::expose(this,&local_48,is_exposed != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cppcms_capi_session_set_exposed(cppcms_capi_session *session,char const *key,int is_exposed)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		session->check_loaded_unsaved();
		session->p->expose(key,is_exposed);
	}